

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteSmv.c
# Opt level: O0

int Io_WriteSmvCheckNames(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  bool bVar3;
  int local_2c;
  char *pcStack_28;
  int i;
  char *pName;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_2c) {
      return 1;
    }
    pAVar2 = Abc_NtkObj(pNtk,local_2c);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      pcStack_28 = Nm_ManFindNameById(pNtk->pManName,local_2c);
      while( true ) {
        bVar3 = false;
        if (pcStack_28 != (char *)0x0) {
          bVar3 = *pcStack_28 != '\0';
        }
        if (!bVar3) break;
        if ((*pcStack_28 == '(') || (*pcStack_28 == ')')) {
          return 0;
        }
        pcStack_28 = pcStack_28 + 1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Io_WriteSmvCheckNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    char * pName;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        for ( pName = Nm_ManFindNameById(pNtk->pManName, i); pName && *pName; pName++ )
            if ( *pName == '(' || *pName == ')' )
                return 0;
    return 1;
}